

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall CppGenerator::genComputeGroupFiles(CppGenerator *this,size_t group)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  undefined8 *puVar4;
  long *plVar5;
  ostream *poVar6;
  size_type *psVar7;
  long *plVar8;
  ulong *puVar9;
  undefined8 *puVar10;
  size_t sVar11;
  char cVar12;
  ulong uVar13;
  ulong uVar14;
  string __str_2;
  string __str_3;
  string __str_1;
  string __str;
  ofstream ofs;
  ulong *local_338;
  long local_330;
  ulong local_328;
  long lStack_320;
  undefined8 *local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  string local_2f8;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8;
  long lStack_2c0;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  long lStack_2a0;
  CppGenerator *local_298;
  ulong *local_290;
  uint local_288;
  undefined4 uStack_284;
  ulong local_280 [2];
  char *local_270;
  uint local_268;
  char local_260 [16];
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_338 = &local_328;
  local_298 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_338);
  cVar12 = '\x01';
  if (9 < group) {
    sVar11 = group;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (sVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_001f4c1b;
      }
      if (sVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_001f4c1b;
      }
      if (sVar11 < 10000) goto LAB_001f4c1b;
      bVar2 = 99999 < sVar11;
      sVar11 = sVar11 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_001f4c1b:
  local_2d8 = &local_2c8;
  std::__cxx11::string::_M_construct((ulong)&local_2d8,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2d8,(uint)local_2d0,group);
  uVar14 = 0xf;
  if (local_338 != &local_328) {
    uVar14 = local_328;
  }
  if (uVar14 < (ulong)(local_2d0 + local_330)) {
    uVar14 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar14 = local_2c8;
    }
    if (uVar14 < (ulong)(local_2d0 + local_330)) goto LAB_001f4c7f;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,(ulong)local_338);
  }
  else {
LAB_001f4c7f:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_2d8);
  }
  local_318 = &local_308;
  puVar10 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar10) {
    local_308 = *puVar10;
    uStack_300 = puVar4[3];
  }
  else {
    local_308 = *puVar10;
    local_318 = (undefined8 *)*puVar4;
  }
  local_310 = puVar4[1];
  *puVar4 = puVar10;
  puVar4[1] = 0;
  *(undefined1 *)puVar10 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_318);
  paVar1 = &local_2f8.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2f8.field_2._M_allocated_capacity = *psVar7;
    local_2f8.field_2._8_8_ = plVar5[3];
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar7;
    local_2f8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2f8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::ofstream::ofstream(&local_230,(string *)&local_2f8,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338);
  }
  cVar12 = '\x01';
  if (9 < group) {
    sVar11 = group;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (sVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_001f4de9;
      }
      if (sVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_001f4de9;
      }
      if (sVar11 < 10000) goto LAB_001f4de9;
      bVar2 = 99999 < sVar11;
      sVar11 = sVar11 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_001f4de9:
  local_270 = local_260;
  std::__cxx11::string::_M_construct((ulong)&local_270,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_270,local_268,group);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x2b2b51);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_240 = *plVar8;
    lStack_238 = plVar5[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *plVar8;
    local_250 = (long *)*plVar5;
  }
  local_248 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_2a8 = *puVar9;
    lStack_2a0 = plVar5[3];
    local_2b8 = &local_2a8;
  }
  else {
    local_2a8 = *puVar9;
    local_2b8 = (ulong *)*plVar5;
  }
  local_2b0 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_2c8 = *puVar9;
    lStack_2c0 = plVar5[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar9;
    local_2d8 = (ulong *)*plVar5;
  }
  local_2d0 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < group) {
    sVar11 = group;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (sVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_001f4fa1;
      }
      if (sVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_001f4fa1;
      }
      if (sVar11 < 10000) goto LAB_001f4fa1;
      bVar2 = 99999 < sVar11;
      sVar11 = sVar11 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_001f4fa1:
  local_290 = local_280;
  std::__cxx11::string::_M_construct((ulong)&local_290,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_290,local_288,group);
  uVar14 = CONCAT44(uStack_284,local_288) + local_2d0;
  uVar13 = 0xf;
  if (local_2d8 != &local_2c8) {
    uVar13 = local_2c8;
  }
  if (uVar13 < uVar14) {
    uVar13 = 0xf;
    if (local_290 != local_280) {
      uVar13 = local_280[0];
    }
    if (uVar13 < uVar14) goto LAB_001f5020;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d8);
  }
  else {
LAB_001f5020:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_290);
  }
  local_338 = &local_328;
  puVar9 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar9) {
    local_328 = *puVar9;
    lStack_320 = puVar4[3];
  }
  else {
    local_328 = *puVar9;
    local_338 = (ulong *)*puVar4;
  }
  local_330 = puVar4[1];
  *puVar4 = puVar9;
  puVar4[1] = 0;
  *(undefined1 *)puVar9 = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_338);
  puVar10 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar10) {
    local_308 = *puVar10;
    uStack_300 = puVar4[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar10;
    local_318 = (undefined8 *)*puVar4;
  }
  local_310 = puVar4[1];
  *puVar4 = puVar10;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_318);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2f8.field_2._M_allocated_capacity = *psVar7;
    local_2f8.field_2._8_8_ = plVar5[3];
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar7;
    local_2f8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2f8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338);
  }
  if (local_290 != local_280) {
    operator_delete(local_290);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  local_2d8 = &local_2c8;
  if (local_298->_parallelizeGroup[group] == true) {
    std::__cxx11::string::_M_construct((ulong)&local_2d8,'\x03');
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_328 = *puVar9;
      lStack_320 = plVar5[3];
      local_338 = &local_328;
    }
    else {
      local_328 = *puVar9;
      local_338 = (ulong *)*plVar5;
    }
    local_330 = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cVar12 = '\x01';
    if (9 < group) {
      sVar11 = group;
      cVar3 = '\x04';
      do {
        cVar12 = cVar3;
        if (sVar11 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_001f53a4;
        }
        if (sVar11 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_001f53a4;
        }
        if (sVar11 < 10000) goto LAB_001f53a4;
        bVar2 = 99999 < sVar11;
        sVar11 = sVar11 / 10000;
        cVar3 = cVar12 + '\x04';
      } while (bVar2);
      cVar12 = cVar12 + '\x01';
    }
LAB_001f53a4:
    local_2b8 = &local_2a8;
    std::__cxx11::string::_M_construct((ulong)&local_2b8,cVar12);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b8,(uint)local_2b0,group);
    uVar14 = 0xf;
    if (local_338 != &local_328) {
      uVar14 = local_328;
    }
    if (uVar14 < (ulong)(local_2b0 + local_330)) {
      uVar14 = 0xf;
      if (local_2b8 != &local_2a8) {
        uVar14 = local_2a8;
      }
      if (uVar14 < (ulong)(local_2b0 + local_330)) goto LAB_001f5414;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_338);
    }
    else {
LAB_001f5414:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_2b8);
    }
    puVar10 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar10) {
      local_308 = *puVar10;
      uStack_300 = puVar4[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar10;
      local_318 = (undefined8 *)*puVar4;
    }
    local_310 = puVar4[1];
    *puVar4 = puVar10;
    puVar4[1] = 0;
    *(undefined1 *)puVar10 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_318);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2f8.field_2._M_allocated_capacity = *psVar7;
      local_2f8.field_2._8_8_ = plVar5[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar7;
      local_2f8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_2f8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&local_2d8,'\x03');
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
    puVar9 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar9) {
      local_328 = *puVar9;
      lStack_320 = puVar4[3];
      local_338 = &local_328;
    }
    else {
      local_328 = *puVar9;
      local_338 = (ulong *)*puVar4;
    }
    local_330 = puVar4[1];
    *puVar4 = puVar9;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    cVar12 = '\x01';
    if (9 < group) {
      sVar11 = group;
      cVar3 = '\x04';
      do {
        cVar12 = cVar3;
        if (sVar11 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_001f54ec;
        }
        if (sVar11 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_001f54ec;
        }
        if (sVar11 < 10000) goto LAB_001f54ec;
        bVar2 = 99999 < sVar11;
        sVar11 = sVar11 / 10000;
        cVar3 = cVar12 + '\x04';
      } while (bVar2);
      cVar12 = cVar12 + '\x01';
    }
LAB_001f54ec:
    local_2b8 = &local_2a8;
    std::__cxx11::string::_M_construct((ulong)&local_2b8,cVar12);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b8,(uint)local_2b0,group);
    uVar14 = 0xf;
    if (local_338 != &local_328) {
      uVar14 = local_328;
    }
    if (uVar14 < (ulong)(local_2b0 + local_330)) {
      uVar14 = 0xf;
      if (local_2b8 != &local_2a8) {
        uVar14 = local_2a8;
      }
      if (uVar14 < (ulong)(local_2b0 + local_330)) goto LAB_001f555c;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_338);
    }
    else {
LAB_001f555c:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_2b8);
    }
    puVar10 = puVar4 + 2;
    if ((undefined8 *)*puVar4 == puVar10) {
      local_308 = *puVar10;
      uStack_300 = puVar4[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar10;
      local_318 = (undefined8 *)*puVar4;
    }
    local_310 = puVar4[1];
    *puVar4 = puVar10;
    puVar4[1] = 0;
    *(undefined1 *)puVar10 = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
    psVar7 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2f8.field_2._M_allocated_capacity = *psVar7;
      local_2f8.field_2._8_8_ = puVar4[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar7;
      local_2f8._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_2f8._M_string_length = puVar4[1];
    *puVar4 = psVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8);
  }
  cVar12 = '\x01';
  if (9 < group) {
    sVar11 = group;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (sVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_001f56d4;
      }
      if (sVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_001f56d4;
      }
      if (sVar11 < 10000) goto LAB_001f56d4;
      bVar2 = 99999 < sVar11;
      sVar11 = sVar11 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_001f56d4:
  local_338 = &local_328;
  std::__cxx11::string::_M_construct((ulong)&local_338,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_338,(uint)local_330,group);
  puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x2b2bca);
  puVar10 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar10) {
    local_308 = *puVar10;
    uStack_300 = puVar4[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar10;
    local_318 = (undefined8 *)*puVar4;
  }
  local_310 = puVar4[1];
  *puVar4 = puVar10;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_318);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2f8.field_2._M_allocated_capacity = *psVar7;
    local_2f8.field_2._8_8_ = plVar5[3];
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar7;
    local_2f8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2f8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338);
  }
  std::ofstream::close();
  local_338 = &local_328;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,
             DAT_002db4a0 + multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_338);
  cVar12 = '\x01';
  if (9 < group) {
    sVar11 = group;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (sVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_001f5877;
      }
      if (sVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_001f5877;
      }
      if (sVar11 < 10000) goto LAB_001f5877;
      bVar2 = 99999 < sVar11;
      sVar11 = sVar11 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_001f5877:
  local_2d8 = &local_2c8;
  std::__cxx11::string::_M_construct((ulong)&local_2d8,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2d8,(uint)local_2d0,group);
  uVar14 = 0xf;
  if (local_338 != &local_328) {
    uVar14 = local_328;
  }
  if (uVar14 < (ulong)(local_2d0 + local_330)) {
    uVar14 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar14 = local_2c8;
    }
    if ((ulong)(local_2d0 + local_330) <= uVar14) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,(ulong)local_338);
      goto LAB_001f58f2;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_2d8);
LAB_001f58f2:
  puVar10 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar10) {
    local_308 = *puVar10;
    uStack_300 = puVar4[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar10;
    local_318 = (undefined8 *)*puVar4;
  }
  local_310 = puVar4[1];
  *puVar4 = puVar10;
  puVar4[1] = 0;
  *(undefined1 *)puVar10 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_318);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2f8.field_2._M_allocated_capacity = *psVar7;
    local_2f8.field_2._8_8_ = plVar5[3];
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar7;
    local_2f8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2f8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338);
  }
  cVar12 = '\x01';
  if (9 < group) {
    sVar11 = group;
    cVar3 = '\x04';
    do {
      cVar12 = cVar3;
      if (sVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_001f5a34;
      }
      if (sVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_001f5a34;
      }
      if (sVar11 < 10000) goto LAB_001f5a34;
      bVar2 = 99999 < sVar11;
      sVar11 = sVar11 / 10000;
      cVar3 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_001f5a34:
  local_338 = &local_328;
  std::__cxx11::string::_M_construct((ulong)&local_338,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_338,(uint)local_330,group);
  puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x2b02cf);
  puVar10 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar10) {
    local_308 = *puVar10;
    uStack_300 = puVar4[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar10;
    local_318 = (undefined8 *)*puVar4;
  }
  local_310 = puVar4[1];
  *puVar4 = puVar10;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_318);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_2f8.field_2._M_allocated_capacity = *psVar7;
    local_2f8.field_2._8_8_ = plVar5[3];
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar7;
    local_2f8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_2f8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338);
  }
  if (local_298->_hasDynamicFunctions == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"#include \"DynamicFunctions.h\"\n",0x1e);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_230,"namespace lmfao\n{\n",0x12);
  genComputeGroupFunction_abi_cxx11_(&local_2f8,local_298,group);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"}\n",2);
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _error_with_option_name;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void CppGenerator::genComputeGroupFiles(size_t group)
{
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"ComputeGroup"+std::to_string(group)+".h",
                      std::ofstream::out);

    ofs << "#ifndef INCLUDE_COMPUTEGROUP"+std::to_string(group)+"_HPP_\n"+
        "#define INCLUDE_COMPUTEGROUP"+std::to_string(group)+"_HPP_\n\n"+
        "#include \"DataHandler.h\"\n\nnamespace lmfao\n{\n";
    if (_parallelizeGroup[group])
    {
        // ofs << offset(1)+"void computeGroup"+std::to_string(group)+"(";

        // for (const size_t& viewID : viewGroups[group])
        // {
        //     ofs << "std::vector<"+viewName[viewID]+"_tuple>& "+viewName[viewID]+",";
        //     if (_requireHashing[viewID])
        //     {
        //         ofs << "std::unordered_map<"+viewName[viewID]+"_key,"+
        //             "size_t, "+viewName[viewID]+"_keyhash>& "+viewName[viewID]+"_map,";
        //     }
        // }
        // ofs << "size_t lowerptr, size_t upperptr);\n";
        // ofs << offset(1)+"void
        // computeGroup"+std::to_string(group)+"Parallelized();\n";
         ofs << offset(1)+"void computeGroup"+std::to_string(group)+"();\n";
    }
    else
    {
        ofs << offset(1)+"void computeGroup"+std::to_string(group)+"();\n"; 
    }
    
    ofs << "}\n\n#endif /* INCLUDE_COMPUTEGROUP"+std::to_string(group)+"_HPP_*/\n";
    ofs.close();
        
    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"ComputeGroup"+std::to_string(group)+".cpp",
             std::ofstream::out);

    // TODO:TODO:TODO: We should avoid including DynamicFunctions.h if it is not
    // needed.
    
    ofs << "#include \"ComputeGroup"+std::to_string(group)+".h\"\n";

    if (_hasDynamicFunctions)
        ofs << "#include \"DynamicFunctions.h\"\n";
    
    ofs << "namespace lmfao\n{\n";
    ofs << genComputeGroupFunction(group) << std::endl;
    ofs << "}\n";
    ofs.close();
}